

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

Float __thiscall pbrt::StratifiedSampler::Get1D(StratifiedSampler *this)

{
  uint32_t i;
  uint32_t l;
  int iVar1;
  int iVar2;
  RNG *this_00;
  BasicOptions *pBVar3;
  uint64_t uVar4;
  StratifiedSampler *in_RDI;
  Float delta;
  int stratum;
  uint64_t hash;
  float local_34;
  
  this_00 = (RNG *)((long)(in_RDI->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30 ^
                    (long)(in_RDI->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20 ^
                   (long)in_RDI->dimension << 0x10);
  pBVar3 = GetOptions();
  uVar4 = MixBits((ulong)this_00 ^ (long)pBVar3->seed);
  in_RDI->dimension = in_RDI->dimension + 1;
  i = in_RDI->sampleIndex;
  l = SamplesPerPixel(in_RDI);
  iVar1 = PermutationElement(i,l,(uint32_t)uVar4);
  if ((in_RDI->jitter & 1U) == 0) {
    local_34 = 0.5;
  }
  else {
    local_34 = RNG::Uniform<float>(this_00);
  }
  iVar2 = SamplesPerPixel(in_RDI);
  return ((float)iVar1 + local_34) / (float)iVar2;
}

Assistant:

PBRT_CPU_GPU
    Float Get1D() {
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ GetOptions().seed);
        ++dimension;

        int stratum = PermutationElement(sampleIndex, SamplesPerPixel(), hash);
        Float delta = jitter ? rng.Uniform<Float>() : 0.5f;
        return (stratum + delta) / SamplesPerPixel();
    }